

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_attack_aux_launch(void)

{
  int iVar1;
  borg_item_conflict *pbVar2;
  _Bool _Var3;
  wchar_t wVar4;
  char *what;
  wchar_t wVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  wchar_t wVar9;
  wchar_t local_3c;
  int local_38;
  
  pbVar2 = borg_items;
  uVar7 = (ulong)z_info->pack_size;
  wVar4 = L'\0';
  wVar5 = L'\0';
  if ((((borg_items[uVar7 + 1].iqty != '\0') && (wVar5 = wVar4, borg.trait[0x70] == 0)) &&
      (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
    if (z_info->quiver_size == 0) {
      wVar5 = L'\0';
      local_3c = L'\xffffffff';
    }
    else {
      uVar8 = uVar7 + 0xc;
      lVar6 = uVar7 * 0x388 + 0x2a60;
      local_38 = -1;
      wVar5 = L'\0';
      local_3c = L'\xffffffff';
      do {
        if (borg_items->curses[lVar6 + -0x26] == false) break;
        if ((borg.trait[0x98] == (uint)borg_items->curses[lVar6 + -0x2a]) &&
           (iVar1 = *(int *)(borg_items->curses + lVar6 + -6), 0 < iVar1)) {
          wVar9 = borg.trait[0x94] * borg.trait[0x9a] *
                  ((int)pbVar2[uVar7 + 1].to_d + (int)*(short *)(borg_items->curses + lVar6 + -0x14)
                  + ((borg_items->curses[lVar6 + -0xd] + 1) * (uint)borg_items->curses[lVar6 + -0xe]
                    >> 1));
          _Var3 = borg_item_note_needs_id((borg_item_conflict *)(borg_items->desc + lVar6));
          wVar4 = wVar9 * 99;
          if (!_Var3) {
            wVar4 = wVar9;
          }
          if (L'\0' < wVar4) {
            wVar4 = borg_launch_bolt(L'\0',wVar4,L'\x01',borg.trait[0x9a] * 2 + L'\x06',
                                     (wchar_t)uVar8);
            if ((wVar4 != wVar5) || (iVar1 < local_38)) {
              if (wVar5 <= wVar4) {
                local_38 = iVar1;
                local_3c = (wchar_t)uVar8;
              }
              if (wVar5 < wVar4) {
                wVar5 = wVar4;
              }
            }
          }
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 0x388;
      } while (uVar8 < (ulong)z_info->quiver_size + (ulong)z_info->pack_size + 0xc);
    }
    if (borg_simulate == false) {
      what = format("# Firing missile \'%s\'",borg_items + local_3c);
      borg_note(what);
      borg_keypress(0x66);
      borg_keypress((local_3c - (uint)z_info->pack_size) + 0x24);
      borg_keypress(0x35);
      successful_target = L'\xfffffffe';
    }
  }
  return wVar5;
}

Assistant:

int borg_attack_aux_launch(void)
{
    int n, b_n = 0;

    int k, b_k = -1;
    int d = -1;
    int v, b_v = -1;

    borg_item *bow = &borg_items[INVEN_BOW];

    /* skip if we don't have a bow */
    if (bow->iqty == 0)
        return 0;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Scan the quiver */
    for (k = QUIVER_START; k < QUIVER_END; k++) {

        borg_item *item = &borg_items[k];

        /* Skip empty items */
        if (!item->iqty)
            break;

        /* Skip missiles that don't match the bow */
        if (item->tval != borg.trait[BI_AMMO_TVAL])
            continue;

        /* Skip worthless missiles */
        if (item->value <= 0)
            continue;

        /* Determine average damage */
        d = (item->dd * (item->ds + 1) / 2);
        d = d + item->to_d + bow->to_d;
        d = d * borg.trait[BI_AMMO_POWER] * borg.trait[BI_SHOTS];

        v = item->value;

        /* Boost the perceived damage on unID'd ones so he can get a quick
         * pseudoID on it */
        if (borg_item_note_needs_id(item))
            d = d * 99;

        /* Paranoia */
        if (d <= 0)
            continue;

        /* Choose optimal target of bolt */
        n = borg_launch_bolt(
            0, d, BORG_ATTACK_ARROW, 6 + 2 * borg.trait[BI_AMMO_POWER], k);

        /* if two attacks are equal, pick the cheaper ammo */
        if (n == b_n && v >= b_v)
            continue;

        if (n >= b_n) {
            b_n = n;
            b_v = v;
            b_k = k;
        }
    }

    /* Nothing to use */
    if (b_n < 0)
        return 0;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Do it */
    borg_note(format("# Firing missile '%s'", borg_items[b_k].desc));

    /* Fire */
    borg_keypress('f');

    /* Use the missile from the quiver */
    borg_keypress(((b_k - QUIVER_START) + '0'));

    /* Use target */
    borg_keypress('5');

    /* Set our shooting flag */
    successful_target = -2;

    /* Value */
    return b_n;
}